

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_tests.cpp
# Opt level: O2

double plus_by_inplace(ChebyshevExpansion *ce,ChebyshevExpansion *ce2,int N)

{
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *this;
  CoeffReturnType pdVar1;
  long lVar2;
  bool bVar3;
  
  lVar2 = (long)N;
  while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
    ChebTools::ChebyshevExpansion::operator+=(ce,ce2);
  }
  this = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
         ChebTools::ChebyshevExpansion::coef(ce);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()(this,0);
  return *pdVar1;
}

Assistant:

double plus_by_inplace(ChebyshevExpansion &ce, const ChebyshevExpansion &ce2, int N) {
    for (std::size_t i = 0; i < N; ++i) {
        ce += ce2;
    }
    return ce.coef()(0);
}